

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O1

int Abc_CommandAbc9IsoSt(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  Gia_Man_t *pGVar2;
  uint fVerbose;
  char *pcVar3;
  Vec_Ptr_t *vPosEquivs;
  Vec_Ptr_t *local_30;
  
  fVerbose = 0;
  Extra_UtilGetoptReset();
  while (iVar1 = Extra_UtilGetopt(argc,argv,"vh"), iVar1 == 0x76) {
    fVerbose = fVerbose ^ 1;
  }
  if (iVar1 == -1) {
    pGVar2 = pAbc->pGia;
    if (pGVar2 == (Gia_Man_t *)0x0) {
      pcVar3 = "Abc_CommandAbc9IsoSt(): There is no AIG.\n";
    }
    else if (pGVar2->vCos->nSize - pGVar2->nRegs == 1) {
      pcVar3 = 
      "Abc_CommandAbc9IsoSt(): The AIG has only one PO. Isomorphism detection is not performed.\n";
    }
    else if (pGVar2->nRegs == 0) {
      pGVar2 = Gia_ManIsoStrashReduce(pGVar2,&local_30,fVerbose);
      if (pGVar2 != (Gia_Man_t *)0x0) {
        Abc_FrameReplacePoEquivs(pAbc,&local_30);
        Abc_FrameUpdateGia(pAbc,pGVar2);
        return 0;
      }
      pcVar3 = "Abc_CommandAbc9IsoSt(): Transformation has failed.\n";
    }
    else {
      pcVar3 = "Abc_CommandAbc9IsoSt(): ISO-ST does not work with sequential AIGs.\n";
    }
    iVar1 = -1;
  }
  else {
    Abc_Print(-2,"usage: &isost [-vh]\n");
    Abc_Print(-2,"\t         removes POs with functionally isomorphic combinational COI\n");
    Abc_Print(-2,"\t         (this command relies exclusively on structural hashing)\n");
    pcVar3 = "yes";
    if (fVerbose == 0) {
      pcVar3 = "no";
    }
    Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar3);
    pcVar3 = "\t-h     : print the command usage\n";
    iVar1 = -2;
  }
  Abc_Print(iVar1,pcVar3);
  return 1;
}

Assistant:

int Abc_CommandAbc9IsoSt( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern Gia_Man_t * Gia_ManIsoStrashReduce( Gia_Man_t * p, Vec_Ptr_t ** pvPosEquivs, int fVerbose );
    Gia_Man_t * pAig;
    Vec_Ptr_t * vPosEquivs;
    int c, fVerbose = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "vh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9IsoSt(): There is no AIG.\n" );
        return 1;
    }
    if ( Gia_ManPoNum(pAbc->pGia) == 1 )
    {
        Abc_Print( -1, "Abc_CommandAbc9IsoSt(): The AIG has only one PO. Isomorphism detection is not performed.\n" );
        return 1;
    }
    if ( Gia_ManRegNum(pAbc->pGia) )
    {
        Abc_Print( -1, "Abc_CommandAbc9IsoSt(): ISO-ST does not work with sequential AIGs.\n" );
        return 1;
    }
    pAig = Gia_ManIsoStrashReduce( pAbc->pGia, &vPosEquivs, fVerbose );
    if ( pAig == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9IsoSt(): Transformation has failed.\n" );
        return 1;
    }
    // update the internal storage of PO equivalences
    Abc_FrameReplacePoEquivs( pAbc, &vPosEquivs );
    // update the AIG
    Abc_FrameUpdateGia( pAbc, pAig );
    return 0;

usage:
    Abc_Print( -2, "usage: &isost [-vh]\n" );
    Abc_Print( -2, "\t         removes POs with functionally isomorphic combinational COI\n" );
    Abc_Print( -2, "\t         (this command relies exclusively on structural hashing)\n" );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}